

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Chapters::Atom::GetStartTime(Atom *this,Chapters *pChapters)

{
  longlong lVar1;
  
  lVar1 = GetTime(pChapters,this->m_start_timecode);
  return lVar1;
}

Assistant:

long long Chapters::Atom::GetStartTime(const Chapters* pChapters) const {
  return GetTime(pChapters, m_start_timecode);
}